

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::ConditionalExpr::to_string_abi_cxx11_(string *__return_storage_ptr__,ConditionalExpr *this)

{
  Var *pVVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pointer local_98;
  pointer pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  string cond_str;
  undefined8 uStack_40;
  
  pVVar1 = this->condition;
  if (pVVar1->type_ == Expression) {
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x1f])(&local_98);
    cond_str.field_2._8_8_ = local_98;
    uStack_40 = pcStack_90;
    bVar2 = fmt::v7::to_string_view<char,_0>("({0})");
    format_str.data_ = (char *)bVar2.size_;
    format_str.size_ = 0xd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&cond_str.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_68,(detail *)bVar2.data_,format_str,args);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x1f])(auStack_68);
  }
  (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])
            ((undefined1 *)((long)&cond_str.field_2 + 8));
  (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])(&local_b8);
  local_98 = (pointer)auStack_68;
  pcStack_90 = cond_str._M_dataplus._M_p;
  local_88 = cond_str.field_2._8_8_;
  uStack_80 = uStack_40;
  local_78 = local_b8;
  uStack_70 = uStack_b0;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} ? {1}: {2}");
  format_str_00.data_ = (char *)bVar2.size_;
  format_str_00.size_ = 0xddd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)bVar2.data_,format_str_00,args_00);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(cond_str.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalExpr::to_string() const {
    std::string cond_str = condition->type() == VarType::Expression
                               ? ::format("({0})", condition->to_string())
                               : condition->to_string();
    return ::format("{0} ? {1}: {2}", cond_str, left->to_string(), right->to_string());
}